

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mount_point.cpp
# Opt level: O0

mount_point * __thiscall cppcms::mount_point::operator=(mount_point *this,mount_point *other)

{
  mount_point *in_RSI;
  mount_point *in_RDI;
  
  if (in_RDI != in_RSI) {
    booster::regex::operator=(&in_RDI->host_,&in_RSI->host_);
    booster::regex::operator=(&in_RDI->script_name_,&in_RSI->script_name_);
    booster::regex::operator=(&in_RDI->path_info_,&in_RSI->path_info_);
    in_RDI->group_ = in_RSI->group_;
    in_RDI->selection_ = in_RSI->selection_;
  }
  return in_RDI;
}

Assistant:

mount_point const &mount_point::operator=(mount_point const &other) 
{
	if(this!=&other) {
		host_ = other.host_;
		script_name_ = other.script_name_;
		path_info_ = other.path_info_;
		group_ = other.group_;
		selection_ = other.selection_;
	}
	return *this;
}